

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

void deqp::ub::anon_unknown_1::generateFullDeclaration
               (ostringstream *src,StructType *structType,int indentLevel)

{
  ostream *poVar1;
  char *pcVar2;
  pointer pSVar3;
  Indent local_44;
  ulong local_40;
  Indent local_38;
  Indent local_34;
  
  std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,"struct");
  if (((structType->m_typeName)._M_string_length != 0) &&
     ((structType->m_typeName)._M_dataplus._M_p != (pointer)0x0)) {
    poVar1 = std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>," ");
    pcVar2 = (char *)(structType->m_typeName)._M_string_length;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (structType->m_typeName)._M_dataplus._M_p;
    }
    std::operator<<(poVar1,pcVar2);
  }
  poVar1 = std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  local_34.level = indentLevel;
  operator<<(poVar1,&local_34);
  std::operator<<(poVar1,"{\n");
  local_40 = (ulong)(uint)indentLevel;
  for (pSVar3 = (structType->m_members).
                super__Vector_base<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar3 != (structType->m_members).
                super__Vector_base<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>.
                _M_impl.super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    local_44.level = indentLevel + 1;
    operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,&local_44);
    generateDeclaration(src,&pSVar3->m_type,(pSVar3->m_name)._M_dataplus._M_p,indentLevel + 1,
                        pSVar3->m_flags & 0xc00);
  }
  local_38.level = (int)local_40;
  operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,&local_38);
  std::operator<<(&src->super_basic_ostream<char,_std::char_traits<char>_>,"}");
  return;
}

Assistant:

void generateFullDeclaration(std::ostringstream& src, const StructType& structType, int indentLevel)
{
	src << "struct";
	if (structType.getTypeName())
		src << " " << structType.getTypeName();
	src << "\n" << Indent(indentLevel) << "{\n";

	for (StructType::ConstIterator memberIter = structType.begin(); memberIter != structType.end(); memberIter++)
	{
		src << Indent(indentLevel + 1);
		generateDeclaration(src, memberIter->getType(), memberIter->getName(), indentLevel + 1,
							memberIter->getFlags() & UNUSED_BOTH);
	}

	src << Indent(indentLevel) << "}";
}